

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_distefano_1999.h
# Opt level: O1

void __thiscall DiStefano::FirstScan(DiStefano *this)

{
  long lVar1;
  int iVar2;
  int iVar3;
  Mat1b *pMVar4;
  long lVar5;
  long lVar6;
  Mat1i *pMVar7;
  long lVar8;
  long lVar9;
  int *piVar10;
  bool *pbVar11;
  uint uVar12;
  bool bVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  int *piVar21;
  long lVar22;
  long lVar23;
  
  this->i_new_label = 0;
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  if (0 < *(int *)&pMVar4->field_0x8) {
    lVar5 = *(long *)&pMVar4->field_0x10;
    lVar6 = **(long **)&pMVar4->field_0x48;
    pMVar7 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
    lVar8 = *(long *)&pMVar7->field_0x10;
    lVar9 = **(long **)&pMVar7->field_0x48;
    lVar22 = 0;
    do {
      uVar19 = (ulong)*(uint *)&pMVar4->field_0xc;
      if (0 < (int)*(uint *)&pMVar4->field_0xc) {
        lVar15 = lVar9 * lVar22 + lVar8;
        lVar1 = lVar15 - lVar9;
        piVar10 = this->a_class;
        pbVar11 = this->a_single;
        lVar23 = 0;
        do {
          if (*(char *)(lVar6 * lVar22 + lVar5 + lVar23) == '\0') {
            uVar19 = 0;
          }
          else {
            uVar16 = 0;
            uVar14 = 0;
            uVar17 = 0;
            uVar12 = 0;
            if (lVar22 != 0) {
              uVar12 = 0;
              if (lVar23 != 0) {
                uVar14 = *(uint *)(lVar1 + -4 + lVar23 * 4);
              }
              uVar17 = *(uint *)(lVar1 + lVar23 * 4);
              if (lVar23 < (int)uVar19 + -1) {
                uVar12 = *(uint *)(lVar1 + 4 + lVar23 * 4);
              }
            }
            if (lVar23 != 0) {
              uVar16 = (ulong)*(uint *)(lVar15 + -4 + lVar23 * 4);
            }
            if ((((uVar14 == 0) && (uVar17 == 0)) && (uVar12 == 0)) && ((int)uVar16 == 0)) {
              iVar2 = this->i_new_label;
              uVar19 = (long)iVar2 + 1;
              this->i_new_label = (int)uVar19;
              piVar10[(long)iVar2 + 1] = (int)uVar19;
              bVar13 = true;
              uVar18 = uVar19 & 0xffffffff;
LAB_001810e4:
              pbVar11[uVar19] = bVar13;
              uVar19 = uVar18;
            }
            else {
              if (uVar14 != 0) {
                uVar17 = uVar14;
              }
              uVar18 = (ulong)uVar17;
              if ((int)uVar17 < 1) {
                uVar18 = (ulong)uVar12;
              }
              else if (0 < (int)uVar12) {
                iVar2 = piVar10[uVar18];
                iVar3 = piVar10[uVar12];
                if (iVar2 != iVar3) {
                  piVar21 = piVar10 + uVar18;
                  if (pbVar11[iVar2] == true) {
                    *piVar21 = iVar3;
                    piVar21 = piVar10 + uVar12;
                  }
                  else {
                    if (pbVar11[iVar3] == false) {
                      if (0 < this->i_new_label) {
                        lVar20 = 0;
                        do {
                          if (piVar10[lVar20 + 1] == iVar3) {
                            piVar10[lVar20 + 1] = *piVar21;
                          }
                          lVar20 = lVar20 + 1;
                        } while (lVar20 < this->i_new_label);
                      }
                      goto LAB_00181164;
                    }
                    piVar10[uVar12] = iVar2;
                  }
                  pbVar11[*piVar21] = false;
                }
              }
LAB_00181164:
              uVar19 = uVar16;
              if ((0 < (int)uVar18) && (uVar19 = uVar18, 0 < (int)uVar16)) {
                iVar2 = piVar10[uVar18];
                iVar3 = piVar10[uVar16];
                if (iVar2 != iVar3) {
                  if (pbVar11[iVar2] == true) {
                    piVar10[uVar18] = iVar3;
                    iVar2 = piVar10[uVar16];
                  }
                  else {
                    if (pbVar11[iVar3] == false) {
                      if (0 < this->i_new_label) {
                        lVar20 = 0;
                        do {
                          if (piVar10[lVar20 + 1] == iVar3) {
                            piVar10[lVar20 + 1] = piVar10[uVar18];
                          }
                          lVar20 = lVar20 + 1;
                        } while (lVar20 < this->i_new_label);
                      }
                      goto LAB_001811a4;
                    }
                    piVar10[uVar16] = iVar2;
                    iVar2 = piVar10[uVar18];
                  }
                  uVar19 = (ulong)iVar2;
                  bVar13 = false;
                  goto LAB_001810e4;
                }
              }
            }
          }
LAB_001811a4:
          *(int *)(lVar15 + lVar23 * 4) = (int)uVar19;
          lVar23 = lVar23 + 1;
          uVar19 = (ulong)*(int *)&pMVar4->field_0xc;
        } while (lVar23 < (long)uVar19);
      }
      lVar22 = lVar22 + 1;
    } while (lVar22 < *(int *)&pMVar4->field_0x8);
  }
  return;
}

Assistant:

void FirstScan()
    {
        i_new_label = 0;

        for (int y = 0; y < img_.rows; y++) {

            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(y);
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(y);
            unsigned int* const img_labels_row_prev = (unsigned int *)(((char *)img_labels_row) - img_labels_.step.p[0]);

            for (int x = 0; x < img_.cols; x++) {
                if (img_row[x]) {

                    int lp(0), lq(0), lr(0), ls(0), lx(0); // lMin(INT_MAX);
                    if (y > 0) {
                        if (x > 0)
                            lp = img_labels_row_prev[x - 1];
                        lq = img_labels_row_prev[x];
                        if (x < img_.cols - 1)
                            lr = img_labels_row_prev[x + 1];
                    }
                    if (x > 0)
                        ls = img_labels_row[x - 1];

                    // If everything around is background
                    if (lp == 0 && lq == 0 && lr == 0 && ls == 0) {
                        lx = ++i_new_label;
                        a_class[lx] = lx;
                        a_single[lx] = true;
                    }
                    else {
                        // p
                        lx = lp;
                        // q
                        if (lx == 0)
                            lx = lq;
                        // r
                        if (lx > 0) {
                            if (lr > 0 && a_class[lx] != a_class[lr]) {
                                if (a_single[a_class[lx]]) {
                                    a_class[lx] = a_class[lr];
                                    a_single[a_class[lr]] = false;
                                }
                                else if (a_single[a_class[lr]]) {
                                    a_class[lr] = a_class[lx];
                                    a_single[a_class[lx]] = false;
                                }
                                else {
                                    int i_class = a_class[lr];
                                    for (int k = 1; k <= i_new_label; k++) {
                                        if (a_class[k] == i_class) {
                                            a_class[k] = a_class[lx];
                                        }
                                    }
                                }
                            }
                        }
                        else
                            lx = lr;
                        // s
                        if (lx > 0) {
                            if (ls > 0 && a_class[lx] != a_class[ls]) {
                                if (a_single[a_class[lx]]) {
                                    a_class[lx] = a_class[ls];
                                    a_single[a_class[ls]] = false;
                                }
                                else if (a_single[a_class[ls]]) {
                                    a_class[ls] = a_class[lx];
                                    a_single[a_class[lx]] = false;
                                }
                                else {
                                    int i_class = a_class[ls];
                                    for (int k = 1; k <= i_new_label; k++) {
                                        if (a_class[k] == i_class) {
                                            a_class[k] = a_class[lx];
                                        }
                                    }
                                }
                            }
                        }
                        else
                            lx = ls;
                    }

                    img_labels_row[x] = lx;
                }
                else
                    img_labels_row[x] = 0;
            }
        }
    }